

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> * __thiscall
wasm::WATParser::ParseModuleTypesCtx::getHeapTypeFromIdx
          (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
           *__return_storage_ptr__,ParseModuleTypesCtx *this,Index idx)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pHVar3;
  string local_68;
  Err local_48;
  
  pHVar3 = (this->types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)idx <
      (ulong)((long)(this->types->
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pHVar3 >> 3)) {
    *(uintptr_t *)
     &(__return_storage_ptr__->val).
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
         = pHVar3[idx].id;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
     + 8) = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
     + 0x20) = '\0';
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"type index out of bounds","");
    Lexer::err(&local_48,&this->in,&local_68);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                     .
                     super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).
      super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
      .
      super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
         = puVar1;
    paVar2 = &local_48.msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.msg._M_dataplus._M_p == paVar2) {
      *puVar1 = CONCAT71(local_48.msg.field_2._M_allocated_capacity._1_7_,
                         local_48.msg.field_2._M_local_buf[0]);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
       + 0x18) = local_48.msg.field_2._8_8_;
    }
    else {
      *(pointer *)
       &(__return_storage_ptr__->val).
        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
        .
        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
        .
        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
        .
        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           = local_48.msg._M_dataplus._M_p;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                + 0x10) =
           CONCAT71(local_48.msg.field_2._M_allocated_capacity._1_7_,
                    local_48.msg.field_2._M_local_buf[0]);
    }
    *(size_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
     + 8) = local_48.msg._M_string_length;
    local_48.msg._M_string_length = 0;
    local_48.msg.field_2._M_local_buf[0] = '\0';
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
     + 0x20) = '\x01';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      local_48.msg._M_dataplus._M_p = (pointer)paVar2;
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<HeapTypeT> getHeapTypeFromIdx(Index idx) {
    if (idx >= types.size()) {
      return in.err("type index out of bounds");
    }
    return types[idx];
  }